

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fibonacci.cpp
# Opt level: O2

int genFibonacci(int *num)

{
  int iVar1;
  int iVar2;
  uint local_18;
  int local_14;
  
  local_18 = *num;
  if (1 < local_18) {
    local_14 = local_18 - 1;
    iVar1 = genFibonacci(&local_14);
    _local_18 = CONCAT44(local_14,*num + -2);
    iVar2 = genFibonacci((int *)&local_18);
    local_18 = iVar2 + iVar1;
  }
  return local_18;
}

Assistant:

inline int genFibonacci(const int& num){
    if(num == 0){
        return 0;
    } else if(num == 1){
        return 1;
    } else {
        return genFibonacci(num-1)+genFibonacci(num-2);
    }
}